

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O1

void math::internal::matrix_apply_householder_matrix<double>
               (double *mat_a,int rows,int cols,double *house_mat,int house_length,int offset_rows,
               int offset_cols)

{
  undefined1 auVar1 [8];
  ulong uVar2;
  int iVar3;
  undefined4 in_register_0000008c;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  uint uVar7;
  double dVar8;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> rhs;
  allocator_type local_35;
  int local_34;
  
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(in_register_0000008c,offset_rows);
  uVar7 = (cols - rows) + house_length;
  local_34 = cols;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,(long)(int)(uVar7 * house_length),
             &local_35);
  if (0 < house_length) {
    iVar3 = (int)rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage * local_34 + offset_cols;
    uVar4 = 0;
    auVar1 = local_60;
    do {
      if (0 < (int)uVar7) {
        uVar5 = 0;
        do {
          *(double *)((long)auVar1 + uVar5 * 8) = mat_a[iVar3 + (int)uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
      }
      uVar4 = uVar4 + 1;
      auVar1 = (undefined1  [8])((long)auVar1 + (long)(int)uVar7 * 8);
      iVar3 = iVar3 + local_34;
    } while (uVar4 != (uint)house_length);
  }
  if (rows - (int)rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != 0 &&
      (int)rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage <= rows) {
    uVar4 = 0;
    do {
      if (0 < local_34 - offset_cols) {
        uVar5 = 0;
        auVar1 = local_60;
        do {
          dVar8 = 0.0;
          if (0 < house_length) {
            uVar2 = 0;
            pdVar6 = (double *)auVar1;
            do {
              dVar8 = dVar8 + house_mat[uVar2] * *pdVar6;
              uVar2 = uVar2 + 1;
              pdVar6 = pdVar6 + (int)uVar7;
            } while ((uint)house_length != uVar2);
          }
          mat_a[((int)uVar4 +
                (int)rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) * local_34 + offset_cols +
                (int)uVar5] = dVar8;
          uVar5 = uVar5 + 1;
          auVar1 = (undefined1  [8])((long)auVar1 + 8);
        } while (uVar5 != (uint)(local_34 - offset_cols));
      }
      uVar4 = uVar4 + 1;
      house_mat = house_mat + house_length;
    } while (uVar4 != (uint)(rows - (int)rhs.super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage));
  }
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60);
  }
  return;
}

Assistant:

void
matrix_apply_householder_matrix (T* mat_a, int rows, int cols,
    T const* house_mat, int house_length, int offset_rows, int offset_cols)
{
    /* Save block from old matrix that will be modified. */
    int house_length_n = house_length - (rows - cols);
    std::vector<T> rhs(house_length * house_length_n);
    for (int i = 0; i < house_length; ++i)
    {
        for (int j = 0; j < house_length_n; ++j)
        {
            rhs[i * house_length_n + j] = mat_a[(offset_rows + i) *
                cols + (offset_cols + j)];
        }
    }

    /* Multiply block matrices. */
    for (int i = 0; i < (rows - offset_rows); ++i)
    {
        for (int j = 0; j < (cols - offset_cols); ++j)
        {
            T current(0);
            for (int k = 0; k < house_length; ++k)
            {
                current += (house_mat[i * house_length + k] *
                    rhs[k * house_length_n + j]);
            }
            mat_a[(offset_rows + i) * cols + (offset_cols + j)] = current;
        }
    }
}